

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataParser::Expected(DataParser *this,String *expected_symbols)

{
  char cVar1;
  String local_30;
  
  if (this->reached_end == false) {
    cVar1 = (this->expression)._M_dataplus._M_p[this->index];
  }
  else {
    cVar1 = '\0';
  }
  if (cVar1 == '\0') {
    CreateString_abi_cxx11_
              (&local_30,"Expected %s but found end of string.",(expected_symbols->_M_dataplus)._M_p
              );
    Error(this,&local_30);
  }
  else {
    CreateString_abi_cxx11_
              (&local_30,"Expected %s but found character \'%c\'.",
               (expected_symbols->_M_dataplus)._M_p,(ulong)(uint)(int)cVar1);
    Error(this,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Expected(const String& expected_symbols)
	{
		const char c = Look();
		if (c == '\0')
			Error(CreateString("Expected %s but found end of string.", expected_symbols.c_str()));
		else
			Error(CreateString("Expected %s but found character '%c'.", expected_symbols.c_str(), c));
	}